

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceExamples.cpp
# Opt level: O2

void readRgba2(char *fileName)

{
  int iVar1;
  Box2i *pBVar2;
  int scanLine2;
  long lVar3;
  size_t yStride;
  long lVar4;
  Array2D<Imf_2_5::Rgba> pixels;
  RgbaInputFile file;
  
  iVar1 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile(&file,fileName,iVar1);
  pBVar2 = Imf_2_5::RgbaInputFile::dataWindow(&file);
  lVar4 = (long)(pBVar2->min).x;
  lVar3 = (long)(pBVar2->min).y;
  iVar1 = (pBVar2->max).y;
  yStride = ((pBVar2->max).x - lVar4) + 1;
  Imf_2_5::Array2D<Imf_2_5::Rgba>::Array2D(&pixels,10,yStride);
  lVar4 = -(lVar4 * 8 + lVar3 * yStride * 8);
  for (; lVar3 <= iVar1; lVar3 = lVar3 + 10) {
    Imf_2_5::RgbaInputFile::setFrameBuffer
              (&file,(Rgba *)((long)&((pixels._data)->r)._h + lVar4),1,yStride);
    scanLine2 = (int)lVar3 + 9;
    if (iVar1 < scanLine2) {
      scanLine2 = iVar1;
    }
    Imf_2_5::RgbaInputFile::readPixels(&file,(int)lVar3,scanLine2);
    lVar4 = lVar4 + yStride * -0x50;
  }
  Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D(&pixels);
  Imf_2_5::RgbaInputFile::~RgbaInputFile(&file);
  return;
}

Assistant:

void
readRgba2 (const char fileName[])
{
    //
    // Read an RGBA image using class RgbaInputFile.
    // Read the pixels, 10 scan lines at a time, and
    // store the pixel data in a buffer that is just
    // large enough to hold 10 scan lines worth of data.
    //
    //	- open the file
    //	- allocate memory for the pixels
    //	- for each block of 10 scan lines,
    //	  describe the memory layout of the pixels,
    //	  read the pixels from the file,
    //	  process the pixels and discard them
    //

    RgbaInputFile file (fileName);
    Box2i dw = file.dataWindow();

    int width  = dw.max.x - dw.min.x + 1;

    Array2D<Rgba> pixels (10, width);

    while (dw.min.y <= dw.max.y)
    {
	file.setFrameBuffer (&pixels[0][0] - dw.min.x - dw.min.y * width,
			     1, width);

	file.readPixels (dw.min.y, min (dw.min.y + 9, dw.max.y));
	// processPixels (pixels)
	
	dw.min.y += 10;
    }
}